

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void HorizontalPred(uint8_t *dst,uint8_t *left,int size)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int j;
  int in_stack_ffffffffffffffe8;
  int iVar1;
  
  if (in_RSI == 0) {
    Fill((uint8_t *)0x0,in_EDX,in_stack_ffffffffffffffe8);
  }
  else {
    for (iVar1 = 0; iVar1 < in_EDX; iVar1 = iVar1 + 1) {
      memset((void *)(in_RDI + (iVar1 << 5)),(uint)*(byte *)(in_RSI + iVar1),(long)in_EDX);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void HorizontalPred(uint8_t* WEBP_RESTRICT dst,
                                       const uint8_t* WEBP_RESTRICT left,
                                       int size) {
  if (left != NULL) {
    int j;
    for (j = 0; j < size; ++j) {
      memset(dst + j * BPS, left[j], size);
    }
  } else {
    Fill(dst, 129, size);
  }
}